

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Arguments::parse(Arguments *this,int argc,char **argv)

{
  bool bVar1;
  pointer pcVar2;
  bool bVar3;
  Entry *pEVar4;
  bool *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Debug local_60;
  string local_40;
  
  bVar3 = tryParse(this,argc,argv);
  pcVar2 = (this->_prefix)._M_dataplus._M_p;
  local_60._output = (ostream *)&local_60._sourceLocationFile;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (this->_prefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  pEVar4 = find(this,(string *)&local_60);
  pbVar5 = Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::operator[]<unsigned_long,_0>
                     (&this->_booleans,pEVar4->id);
  bVar1 = *pbVar5;
  if (local_60._output != (ostream *)&local_60._sourceLocationFile) {
    operator_delete(local_60._output);
  }
  if (bVar1 == false) {
    if (bVar3) {
      return;
    }
    Debug::Debug(&local_60,(Flags)0x1);
    usage_abi_cxx11_(&local_40,this);
    Utility::operator<<(&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Debug::~Debug(&local_60);
    exit(1);
  }
  Debug::Debug(&local_60,(Flags)0x1);
  help_abi_cxx11_(&local_40,this);
  Utility::operator<<(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Debug::~Debug(&local_60);
  exit(0);
}

Assistant:

void Arguments::parse(const int argc, const char* const* const argv) {
    const bool status = tryParse(argc, argv);

    if(_booleans[find(_prefix + "help")->id]) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << help();
        std::exit(0);
        /* LCOV_EXCL_STOP */
    }

    if(!status) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << usage();
        std::exit(1);
        /* LCOV_EXCL_STOP */
    }
}